

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningRVW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,EulerAngles *OrientationOut,
          KFLOAT32 totalTimeSinceReset)

{
  Vector local_a8;
  Vector local_80;
  WorldCoordinates local_68;
  WorldCoordinates local_48;
  KFLOAT32 local_24;
  EulerAngles *pEStack_20;
  KFLOAT32 totalTimeSinceReset_local;
  EulerAngles *OrientationOut_local;
  WorldCoordinates *PositionOut_local;
  DeadReckoningCalculator *this_local;
  
  local_24 = totalTimeSinceReset;
  pEStack_20 = OrientationOut;
  OrientationOut_local = (EulerAngles *)PositionOut;
  PositionOut_local = &this->m_initPosition;
  DATA_TYPE::Vector::operator*(&local_80,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_68,&this->m_initPosition,&local_80);
  DATA_TYPE::Vector::operator*
            (&local_a8,&this->m_initLinearAcceleration,
             (KFLOAT64)((double)(float)local_24 * 0.5 * (double)(float)local_24));
  DATA_TYPE::WorldCoordinates::operator+(&local_48,&local_68,&local_a8);
  DATA_TYPE::WorldCoordinates::operator=((WorldCoordinates *)OrientationOut_local,&local_48);
  DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_48);
  DATA_TYPE::Vector::~Vector(&local_a8);
  DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_68);
  DATA_TYPE::Vector::~Vector(&local_80);
  calcOrientation_simplified(this,pEStack_20,local_24);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningRVW(  WorldCoordinates & PositionOut, EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) +
                    ( m_initLinearAcceleration * ( 0.5 * totalTimeSinceReset * totalTimeSinceReset ) ) );
    //calcOrientation(OrientationOut);
    calcOrientation_simplified( OrientationOut, totalTimeSinceReset );
}